

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_parse_custom_request(connectdata *conn)

{
  SessionHandle *data_00;
  void *pvVar1;
  char *pcVar2;
  bool bVar3;
  char *local_38;
  char *params;
  char *custom;
  IMAP *imap;
  SessionHandle *data;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  pvVar1 = (data_00->req).protop;
  pcVar2 = (data_00->set).str[4];
  if ((pcVar2 != (char *)0x0) &&
     (data._4_4_ = Curl_urldecode(data_00,pcVar2,0,(char **)((long)pvVar1 + 0x38),(size_t *)0x0,true
                                 ), data._4_4_ == CURLE_OK)) {
    local_38 = *(char **)((long)pvVar1 + 0x38);
    while( true ) {
      bVar3 = false;
      if (*local_38 != '\0') {
        bVar3 = *local_38 != ' ';
      }
      if (!bVar3) break;
      local_38 = local_38 + 1;
    }
    if (*local_38 != '\0') {
      pcVar2 = (*Curl_cstrdup)(local_38);
      *(char **)((long)pvVar1 + 0x40) = pcVar2;
      local_38[*(long *)((long)pvVar1 + 0x38) - *(long *)((long)pvVar1 + 0x38)] = '\0';
      if (*(long *)((long)pvVar1 + 0x40) == 0) {
        data._4_4_ = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_parse_custom_request(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct IMAP *imap = data->req.protop;
  const char *custom = data->set.str[STRING_CUSTOMREQUEST];

  if(custom) {
    /* URL decode the custom request */
    result = Curl_urldecode(data, custom, 0, &imap->custom, NULL, TRUE);

    /* Extract the parameters if specified */
    if(!result) {
      const char *params = imap->custom;

      while(*params && *params != ' ')
        params++;

      if(*params) {
        imap->custom_params = strdup(params);
        imap->custom[params - imap->custom] = '\0';

        if(!imap->custom_params)
          result = CURLE_OUT_OF_MEMORY;
      }
    }
  }

  return result;
}